

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O3

void __thiscall
pybind11::cpp_function::
initialize<bool(*&)(std::__cxx11::string_const&),bool,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>
          (cpp_function *this,
          _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **f,
          _func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *param_2,
          name *extra,is_method *extra_1,sibling *extra_2)

{
  ushort uVar1;
  unique_function_record unique_rec;
  unique_function_record local_40;
  sibling *local_38;
  
  local_38 = extra_2;
  make_function_record((cpp_function *)&local_40);
  *(_func_bool_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr **)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x38) =
       *f;
  *(code **)((long)local_40._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       initialize<bool(*&)(std::__cxx11::string_const&),bool,std::__cxx11::string_const&,pybind11::name,pybind11::is_method,pybind11::sibling>(bool(*&)(std::__cxx11::string_const&),bool(*)(std::__cxx11::string_const&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(undefined2 *)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x5e) =
       1;
  uVar1 = *(ushort *)
           ((long)local_40._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) & 0xff3f;
  *(ushort *)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x59) =
       uVar1;
  *(char **)local_40._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       extra->value;
  *(ushort *)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x59) =
       uVar1 | 0x10;
  *(PyObject **)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70) =
       (extra_1->class_).m_ptr;
  *(PyObject **)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78) =
       (local_38->value).m_ptr;
  initialize_generic(this,&local_40,
                     initialize<bool_(*&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_pybind11::name,_pybind11::is_method,_pybind11::sibling>
                     ::signature.text,
                     initialize<bool_(*&)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_bool,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_pybind11::name,_pybind11::is_method,_pybind11::sibling>
                     ::types._M_elems,1);
  *(byte *)((long)local_40._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_40._M_t.
                       super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 4;
  *(pointer_____offset_0x10___ **)
   ((long)local_40._M_t.
          super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          ._M_t.
          super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
          .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x40) =
       &(*)(std::__cxx11::string_const&)::typeinfo;
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_40);
  return;
}

Assistant:

void initialize(Func &&f, Return (*)(Args...), const Extra &...extra) {
        using namespace detail;
        struct capture {
            remove_reference_t<Func> f;
        };

        /* Store the function including any extra state it might have (e.g. a lambda capture
         * object) */
        // The unique_ptr makes sure nothing is leaked in case of an exception.
        auto unique_rec = make_function_record();
        auto *rec = unique_rec.get();

        /* Store the capture object directly in the function record if there is enough space */
        if (sizeof(capture) <= sizeof(rec->data)) {
            /* Without these pragmas, GCC warns that there might not be
               enough space to use the placement new operator. However, the
               'if' statement above ensures that this is the case. */
            PYBIND11_WARNING_PUSH

#if defined(__GNUG__) && __GNUC__ >= 6
            PYBIND11_WARNING_DISABLE_GCC("-Wplacement-new")
#endif

            new ((capture *) &rec->data) capture{std::forward<Func>(f)};

#if !PYBIND11_HAS_STD_LAUNDER
            PYBIND11_WARNING_DISABLE_GCC("-Wstrict-aliasing")
#endif

            // UB without std::launder, but without breaking ABI and/or
            // a significant refactoring it's "impossible" to solve.
            if (!std::is_trivially_destructible<capture>::value) {
                rec->free_data = [](function_record *r) {
                    auto data = PYBIND11_STD_LAUNDER((capture *) &r->data);
                    (void) data;
                    data->~capture();
                };
            }
            PYBIND11_WARNING_POP
        } else {
            rec->data[0] = new capture{std::forward<Func>(f)};
            rec->free_data = [](function_record *r) { delete ((capture *) r->data[0]); };
        }

        /* Type casters for the function arguments and return value */
        using cast_in = argument_loader<Args...>;
        using cast_out
            = make_caster<conditional_t<std::is_void<Return>::value, void_type, Return>>;

        static_assert(
            expected_num_args<Extra...>(
                sizeof...(Args), cast_in::args_pos >= 0, cast_in::has_kwargs),
            "The number of argument annotations does not match the number of function arguments");

        /* Dispatch code which converts function arguments and performs the actual function call */
        rec->impl = [](function_call &call) -> handle {
            cast_in args_converter;

            /* Try to cast the function arguments into the C++ domain */
            if (!args_converter.load_args(call)) {
                return PYBIND11_TRY_NEXT_OVERLOAD;
            }

            /* Invoke call policy pre-call hook */
            process_attributes<Extra...>::precall(call);

            /* Get a pointer to the capture object */
            const auto *data = (sizeof(capture) <= sizeof(call.func.data) ? &call.func.data
                                                                          : call.func.data[0]);
            auto *cap = const_cast<capture *>(reinterpret_cast<const capture *>(data));

            /* Override policy for rvalues -- usually to enforce rvp::move on an rvalue */
            return_value_policy policy
                = return_value_policy_override<Return>::policy(call.func.policy);

            /* Function scope guard -- defaults to the compile-to-nothing `void_type` */
            using Guard = extract_guard_t<Extra...>;

            /* Perform the function call */
            handle result;
            if (call.func.is_setter) {
                (void) std::move(args_converter).template call<Return, Guard>(cap->f);
                result = none().release();
            } else {
                result = cast_out::cast(
                    std::move(args_converter).template call<Return, Guard>(cap->f),
                    policy,
                    call.parent);
            }

            /* Invoke call policy post-call hook */
            process_attributes<Extra...>::postcall(call, result);

            return result;
        };

        rec->nargs_pos = cast_in::args_pos >= 0
                             ? static_cast<std::uint16_t>(cast_in::args_pos)
                             : sizeof...(Args) - cast_in::has_kwargs; // Will get reduced more if
                                                                      // we have a kw_only
        rec->has_args = cast_in::args_pos >= 0;
        rec->has_kwargs = cast_in::has_kwargs;

        /* Process any user-provided function attributes */
        process_attributes<Extra...>::init(extra..., rec);

        {
            constexpr bool has_kw_only_args = any_of<std::is_same<kw_only, Extra>...>::value,
                           has_pos_only_args = any_of<std::is_same<pos_only, Extra>...>::value,
                           has_arg_annotations = any_of<is_keyword<Extra>...>::value;
            static_assert(has_arg_annotations || !has_kw_only_args,
                          "py::kw_only requires the use of argument annotations");
            static_assert(has_arg_annotations || !has_pos_only_args,
                          "py::pos_only requires the use of argument annotations (for docstrings "
                          "and aligning the annotations to the argument)");

            static_assert(constexpr_sum(is_kw_only<Extra>::value...) <= 1,
                          "py::kw_only may be specified only once");
            static_assert(constexpr_sum(is_pos_only<Extra>::value...) <= 1,
                          "py::pos_only may be specified only once");
            constexpr auto kw_only_pos = constexpr_first<is_kw_only, Extra...>();
            constexpr auto pos_only_pos = constexpr_first<is_pos_only, Extra...>();
            static_assert(!(has_kw_only_args && has_pos_only_args) || pos_only_pos < kw_only_pos,
                          "py::pos_only must come before py::kw_only");
        }

        /* Generate a readable signature describing the function's arguments and return
           value types */
        static constexpr auto signature
            = const_name("(") + cast_in::arg_names + const_name(") -> ") + cast_out::name;
        PYBIND11_DESCR_CONSTEXPR auto types = decltype(signature)::types();

        /* Register the function with Python from generic (non-templated) code */
        // Pass on the ownership over the `unique_rec` to `initialize_generic`. `rec` stays valid.
        initialize_generic(std::move(unique_rec), signature.text, types.data(), sizeof...(Args));

        /* Stash some additional information used by an important optimization in 'functional.h' */
        using FunctionType = Return (*)(Args...);
        constexpr bool is_function_ptr
            = std::is_convertible<Func, FunctionType>::value && sizeof(capture) == sizeof(void *);
        if (is_function_ptr) {
            rec->is_stateless = true;
            rec->data[1]
                = const_cast<void *>(reinterpret_cast<const void *>(&typeid(FunctionType)));
        }
    }